

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getSource
          (Replacer *this,MemoryCopy *curr,Index sizeIdx,Index sourceIdx)

{
  initializer_list<wasm::Expression_*> __l;
  LocalGet *leftOperand;
  LocalGet *rightOperand;
  Expression *pEVar1;
  Builder *this_00;
  allocator<wasm::Expression_*> local_b1;
  Expression *local_b0;
  LocalGet *local_a8;
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> exprs;
  Expression *sourceGet;
  Expression *boundsCheck;
  Expression *sourceValue;
  Index sourceIdx_local;
  Index sizeIdx_local;
  MemoryCopy *curr_local;
  Replacer *this_local;
  
  this_local = (Replacer *)
               addOffsetGlobal(this,curr->source,(Name)(curr->sourceMemory).super_IString.str);
  if ((this->parent->checkBounds & 1U) != 0) {
    this_00 = &this->builder;
    leftOperand = Builder::makeLocalGet(this_00,sourceIdx,(Type)(this->parent->pointerType).id);
    rightOperand = Builder::makeLocalGet(this_00,sizeIdx,(Type)(this->parent->pointerType).id);
    pEVar1 = makeAddGtuMemoryTrap
                       (this,(Expression *)leftOperand,(Expression *)rightOperand,
                        (Name)(curr->sourceMemory).super_IString.str);
    exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(this->parent->pointerType).id;
    local_a8 = Builder::makeLocalGet
                         (this_00,sourceIdx,
                          (Type)exprs.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_a0 = &local_b0;
    local_98 = 2;
    local_b0 = pEVar1;
    std::allocator<wasm::Expression_*>::allocator(&local_b1);
    __l._M_len = local_98;
    __l._M_array = local_a0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_90,__l,
               &local_b1);
    std::allocator<wasm::Expression_*>::~allocator(&local_b1);
    this_local = (Replacer *)
                 Builder::
                 makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                           (&this->builder,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            local_90);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_90);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* getSource(MemoryCopy* curr,
                          Index sizeIdx = Index(-1),
                          Index sourceIdx = Index(-1)) {
      Expression* sourceValue =
        addOffsetGlobal(curr->source, curr->sourceMemory);

      if (parent.checkBounds) {
        Expression* boundsCheck = makeAddGtuMemoryTrap(
          builder.makeLocalGet(sourceIdx, parent.pointerType),
          builder.makeLocalGet(sizeIdx, parent.pointerType),
          curr->sourceMemory);
        Expression* sourceGet =
          builder.makeLocalGet(sourceIdx, parent.pointerType);
        std::vector<Expression*> exprs = {boundsCheck, sourceGet};
        return builder.makeBlock(exprs);
      }

      return sourceValue;
    }